

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int glfwGetError(char **description)

{
  int iVar1;
  _GLFWerror *p_Var2;
  
  if (description != (char **)0x0) {
    *description = (char *)0x0;
  }
  if (_glfw.initialized == 0) {
    p_Var2 = &_glfwMainThreadError;
  }
  else {
    p_Var2 = (_GLFWerror *)_glfwPlatformGetTls(&_glfw.errorSlot);
    if (p_Var2 == (_GLFWerror *)0x0) {
      return 0;
    }
  }
  iVar1 = p_Var2->code;
  p_Var2->code = 0;
  if (iVar1 != 0 && description != (char **)0x0) {
    *description = p_Var2->description;
  }
  return iVar1;
}

Assistant:

GLFWAPI int glfwGetError(const char** description)
{
    _GLFWerror* error;
    int code = GLFW_NO_ERROR;

    if (description)
        *description = NULL;

    if (_glfw.initialized)
        error = _glfwPlatformGetTls(&_glfw.errorSlot);
    else
        error = &_glfwMainThreadError;

    if (error)
    {
        code = error->code;
        error->code = GLFW_NO_ERROR;
        if (description && code)
            *description = error->description;
    }

    return code;
}